

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O3

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  pointer pIVar1;
  bool bVar2;
  ItemVector *pIVar3;
  pointer this_00;
  long lVar4;
  long lVar5;
  pointer pIVar6;
  
  pIVar3 = cmComputeLinkInformation::GetItems(cli);
  this_00 = (pIVar3->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pIVar3->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pIVar1 - (long)this_00;
  lVar4 = (lVar5 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                            *)this_00,
                           (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                            )cli);
      pIVar6 = this_00;
      if (bVar2) goto LAB_004efb14;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                            *)(this_00 + 1),
                           (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                            )cli);
      pIVar6 = this_00 + 1;
      if (bVar2) goto LAB_004efb14;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                            *)(this_00 + 2),
                           (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                            )cli);
      pIVar6 = this_00 + 2;
      if (bVar2) goto LAB_004efb14;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                            *)(this_00 + 3),
                           (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                            )cli);
      pIVar6 = this_00 + 3;
      if (bVar2) goto LAB_004efb14;
      this_00 = this_00 + 4;
      lVar4 = lVar4 + -1;
      lVar5 = lVar5 + -0x120;
    } while (1 < lVar4);
  }
  lVar4 = (lVar5 >> 3) * -0x71c71c71c71c71c7;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pIVar6 = pIVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
                  ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                                *)this_00,
                               (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                )cli), pIVar6 = this_00, bVar2)) goto LAB_004efb14;
      this_00 = this_00 + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                          *)this_00,
                         (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                          )cli);
    pIVar6 = this_00;
    if (bVar2) goto LAB_004efb14;
    this_00 = this_00 + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
          ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                        *)this_00,
                       (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                        )cli);
  pIVar6 = this_00;
  if (!bVar2) {
    pIVar6 = pIVar1;
  }
LAB_004efb14:
  return pIVar6 != pIVar1;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  return std::any_of(
    items.begin(), items.end(),
    [](cmComputeLinkInformation::Item const& item) -> bool {
      return item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY &&
        // this dependency requires us to device link it
        !item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS") &&
        item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION");
    });
}